

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_resp_handlers.cxx
# Opt level: O1

void __thiscall cornerstone::raft_server::handle_ext_resp_err(raft_server *this,rpc_exception *err)

{
  msg_type mVar1;
  element_type *peVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ulong uVar4;
  __uniq_ptr_data<cornerstone::raft_params,_std::default_delete<cornerstone::raft_params>,_true,_true>
  _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  element_type *peVar7;
  long lVar8;
  undefined8 uVar9;
  size_t sVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  _Hash_node_base *p_Var14;
  __node_base_ptr p_Var15;
  __node_base_ptr p_Var16;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false> __it;
  pthread_rwlock_t *__rwlock;
  executor exec;
  ptr<peer> p;
  _Any_data local_168;
  _Manager_type local_158;
  code *pcStack_150;
  undefined1 local_139;
  element_type *local_138;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_130 [2];
  pthread_rwlock_t *local_120;
  raft_server *local_118;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_110;
  raft_server *local_108;
  undefined8 uStack_100;
  undefined1 local_f8 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e8;
  char *local_a0;
  char *local_40;
  
  peVar2 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_40 = "receive an rpc error response from peer server, %s";
  uVar9 = (**(code **)(*(long *)err + 0x10))(err);
  snprintf((char *)&local_108,200,local_40,uVar9);
  local_168._M_unused._M_object = &local_158;
  sVar10 = strlen((char *)&local_108);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_168,&local_108,(long)&local_108 + sVar10);
  (*peVar2->_vptr_logger[2])(peVar2);
  if ((_Manager_type *)local_168._M_unused._0_8_ != &local_158) {
    operator_delete(local_168._M_unused._M_object,(ulong)(local_158 + 1));
  }
  peVar3 = (err->req_).super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (err->req_).super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  mVar1 = (peVar3->super_msg_base).type_;
  if ((mVar1 < leave_cluster_response) &&
     ((0x5400U >> (mVar1 & (install_snapshot_request|leave_cluster_response)) & 1) != 0)) {
    local_138 = (element_type *)0x0;
    a_Stack_130[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (mVar1 == leave_cluster_request) {
      std::__shared_mutex_pthread::lock_shared(&(this->peers_lock_).super___shared_timed_mutex_base)
      ;
      iVar11 = (peVar3->super_msg_base).dst_;
      uVar4 = (this->peers_)._M_h._M_bucket_count;
      uVar13 = (ulong)(long)iVar11 % uVar4;
      p_Var15 = (this->peers_)._M_h._M_buckets[uVar13];
      p_Var16 = (__node_base_ptr)0x0;
      if ((p_Var15 != (__node_base_ptr)0x0) &&
         (p_Var14 = p_Var15->_M_nxt, p_Var16 = p_Var15, iVar11 != *(int *)&p_Var15->_M_nxt[1]._M_nxt
         )) {
        while (p_Var15 = p_Var14, p_Var14 = p_Var15->_M_nxt, p_Var14 != (_Hash_node_base *)0x0) {
          p_Var16 = (__node_base_ptr)0x0;
          if (((ulong)(long)*(int *)&p_Var14[1]._M_nxt % uVar4 != uVar13) ||
             (p_Var16 = p_Var15, iVar11 == *(int *)&p_Var14[1]._M_nxt)) goto LAB_0015249f;
        }
        p_Var16 = (__node_base_ptr)0x0;
      }
LAB_0015249f:
      if (p_Var16 == (__node_base_ptr)0x0) {
        p_Var14 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var14 = p_Var16->_M_nxt;
      }
      if (p_Var14 != (_Hash_node_base *)0x0) {
        local_138 = (element_type *)p_Var14[2]._M_nxt;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (a_Stack_130,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(p_Var14 + 3));
      }
      pthread_rwlock_unlock((pthread_rwlock_t *)&this->peers_lock_);
    }
    else {
      local_138 = (this->srv_to_join_).
                  super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (a_Stack_130,
                 &(this->srv_to_join_).
                  super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    if (local_138 != (element_type *)0x0) {
      _Var5.
      super___uniq_ptr_impl<cornerstone::raft_params,_std::default_delete<cornerstone::raft_params>_>
      ._M_t.
      super__Tuple_impl<0UL,_cornerstone::raft_params_*,_std::default_delete<cornerstone::raft_params>_>
      .super__Head_base<0UL,_cornerstone::raft_params_*,_false>._M_head_impl =
           (((this->ctx_)._M_t.
             super___uniq_ptr_impl<cornerstone::context,_std::default_delete<cornerstone::context>_>
             ._M_t.
             super__Tuple_impl<0UL,_cornerstone::context_*,_std::default_delete<cornerstone::context>_>
             .super__Head_base<0UL,_cornerstone::context_*,_false>._M_head_impl)->params_)._M_t.
           super___uniq_ptr_impl<cornerstone::raft_params,_std::default_delete<cornerstone::raft_params>_>
      ;
      iVar11 = *(int *)((long)_Var5.
                              super___uniq_ptr_impl<cornerstone::raft_params,_std::default_delete<cornerstone::raft_params>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cornerstone::raft_params_*,_std::default_delete<cornerstone::raft_params>_>
                              .super__Head_base<0UL,_cornerstone::raft_params_*,_false>._M_head_impl
                       + 8);
      iVar12 = *(int *)((long)_Var5.
                              super___uniq_ptr_impl<cornerstone::raft_params,_std::default_delete<cornerstone::raft_params>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cornerstone::raft_params_*,_std::default_delete<cornerstone::raft_params>_>
                              .super__Head_base<0UL,_cornerstone::raft_params_*,_false>._M_head_impl
                       + 4) - iVar11 / 2;
      if (iVar12 < iVar11) {
        iVar12 = iVar11;
      }
      if (local_138->current_hb_interval_ < iVar12) {
        peVar2 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_108 = (raft_server *)local_f8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"retry the request","")
        ;
        (*peVar2->_vptr_logger[2])(peVar2,&local_108);
        if (local_108 != (raft_server *)local_f8) {
          operator_delete(local_108,local_f8._0_8_ + 1);
        }
        iVar11 = local_138->rpc_backoff_ + local_138->current_hb_interval_;
        if (local_138->max_hb_interval_ <= iVar11) {
          iVar11 = local_138->max_hb_interval_;
        }
        local_138->current_hb_interval_ = iVar11;
        uStack_100 = local_138;
        local_f8._0_8_ = a_Stack_130[0]._M_pi;
        if (a_Stack_130[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (a_Stack_130[0]._M_pi)->_M_use_count = (a_Stack_130[0]._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (a_Stack_130[0]._M_pi)->_M_use_count = (a_Stack_130[0]._M_pi)->_M_use_count + 1;
          }
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        local_158 = (_Manager_type)0x0;
        pcStack_150 = (code *)0x0;
        local_168._M_unused._M_object = (void *)0x0;
        local_168._8_8_ = 0;
        local_108 = this;
        local_f8._8_8_ = peVar3;
        local_e8 = this_00;
        local_168._M_unused._M_object = operator_new(0x28);
        p_Var6 = local_e8;
        uVar9 = local_f8._0_8_;
        *(raft_server **)local_168._M_unused._0_8_ = local_108;
        *(element_type **)((long)local_168._M_unused._0_8_ + 8) = uStack_100;
        *(_Manager_type *)((long)local_168._M_unused._0_8_ + 0x10) = (_Manager_type)0x0;
        uStack_100 = (element_type *)0x0;
        local_f8._0_8_ = (_func_int **)0x0;
        *(undefined8 *)((long)local_168._M_unused._0_8_ + 0x10) = uVar9;
        *(undefined8 *)((long)local_168._M_unused._0_8_ + 0x18) = local_f8._8_8_;
        *(_Manager_type *)((long)local_168._M_unused._0_8_ + 0x20) = (_Manager_type)0x0;
        local_e8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_168._M_unused._0_8_ + 0x20) =
             p_Var6;
        pcStack_150 = std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/datatechnology[P]cornerstone/src/raft_server_resp_handlers.cxx:460:51)>
                      ::_M_invoke;
        local_158 = std::
                    _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/datatechnology[P]cornerstone/src/raft_server_resp_handlers.cxx:460:51)>
                    ::_M_manager;
        local_118 = (raft_server *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<cornerstone::timer_task<void>,std::allocator<cornerstone::timer_task<void>>,std::function<void()>&>
                  (&_Stack_110,(timer_task<void> **)&local_118,
                   (allocator<cornerstone::timer_task<void>_> *)&local_139,
                   (function<void_()> *)&local_168);
        local_108 = local_118;
        uStack_100 = (element_type *)CONCAT44(_Stack_110._M_pi._4_4_,_Stack_110._M_pi._0_4_);
        peVar7 = (this->scheduler_).
                 super___shared_ptr<cornerstone::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        (*peVar7->_vptr_delayed_task_scheduler[2])
                  (peVar7,&local_108,(ulong)(uint)local_138->current_hb_interval_);
        if (uStack_100 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uStack_100);
        }
        if (local_158 != (_Manager_type)0x0) {
          (*local_158)(&local_168,&local_168,__destroy_functor);
        }
      }
      else {
        peVar2 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if ((peVar3->super_msg_base).type_ == leave_cluster_request) {
          local_40 = 
          "rpc failed again for the removing server (%d), will remove this server directly";
          snprintf((char *)&local_108,200,
                   "rpc failed again for the removing server (%d), will remove this server directly"
                   ,(ulong)(uint)((local_138->config_).
                                  super___shared_ptr<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->id_);
          local_168._M_unused._M_object = &local_158;
          sVar10 = strlen((char *)&local_108);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_168,&local_108,(long)&local_108 + sVar10);
          (*peVar2->_vptr_logger[3])(peVar2,&local_168);
          if ((_Manager_type *)local_168._M_unused._0_8_ != &local_158) {
            operator_delete(local_168._M_unused._M_object,(ulong)(local_158 + 1));
          }
          __rwlock = (pthread_rwlock_t *)&this->peers_lock_;
          iVar11 = pthread_rwlock_wrlock(__rwlock);
          if (iVar11 == 0x23) {
            std::__throw_system_error(0x23);
          }
          if ((this->peers_)._M_h._M_element_count == 1) {
            iVar11 = ((local_138->config_).
                      super___shared_ptr<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     )->id_;
            uVar4 = (this->peers_)._M_h._M_bucket_count;
            uVar13 = (ulong)(long)iVar11 % uVar4;
            p_Var15 = (this->peers_)._M_h._M_buckets[uVar13];
            p_Var16 = (__node_base_ptr)0x0;
            if ((p_Var15 != (__node_base_ptr)0x0) &&
               (p_Var14 = p_Var15->_M_nxt, p_Var16 = p_Var15,
               iVar11 != *(int *)&p_Var15->_M_nxt[1]._M_nxt)) {
              while (p_Var15 = p_Var14, p_Var14 = p_Var15->_M_nxt, p_Var14 != (_Hash_node_base *)0x0
                    ) {
                p_Var16 = (__node_base_ptr)0x0;
                if (((ulong)(long)*(int *)&p_Var14[1]._M_nxt % uVar4 != uVar13) ||
                   (p_Var16 = p_Var15, iVar11 == *(int *)&p_Var14[1]._M_nxt)) goto LAB_0015284d;
              }
              p_Var16 = (__node_base_ptr)0x0;
            }
LAB_0015284d:
            if (p_Var16 == (__node_base_ptr)0x0) {
              __it._M_cur = (__node_type *)0x0;
            }
            else {
              __it._M_cur = (__node_type *)p_Var16->_M_nxt;
            }
            local_120 = __rwlock;
            if (__it._M_cur == (__node_type *)0x0) {
              peVar2 = (this->l_).
                       super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              local_a0 = "peer %d cannot be found, no action for removing";
              snprintf((char *)&local_108,100,"peer %d cannot be found, no action for removing",
                       (ulong)(uint)((local_138->config_).
                                     super___shared_ptr<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->id_);
              local_168._M_unused._M_object = &local_158;
              sVar10 = strlen((char *)&local_108);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_168,&local_108,(long)&local_108 + sVar10);
              (*peVar2->_vptr_logger[3])(peVar2,&local_168);
            }
            else {
              lVar8 = *(long *)((long)__it._M_cur + 0x10);
              *(undefined1 *)(lVar8 + 0x5a) = 0;
              (**(code **)(**(long **)(lVar8 + 0x10) + 0x18))
                        (*(long **)(lVar8 + 0x10),(long *)(lVar8 + 0x60));
              LOCK();
              *(undefined1 *)(*(long *)(lVar8 + 0x60) + 8) = 1;
              UNLOCK();
              std::
              _Hashtable<int,_std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::erase(&(this->peers_)._M_h,(const_iterator)__it._M_cur);
              peVar2 = (this->l_).
                       super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              local_a0 = "server %d is removed from cluster";
              snprintf((char *)&local_108,100,"server %d is removed from cluster",
                       (ulong)(uint)((local_138->config_).
                                     super___shared_ptr<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->id_);
              local_168._M_unused._M_object = &local_158;
              sVar10 = strlen((char *)&local_108);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_168,&local_108,(long)&local_108 + sVar10);
              (*peVar2->_vptr_logger[3])(peVar2,&local_168);
            }
            __rwlock = local_120;
            if ((_Manager_type *)local_168._M_unused._0_8_ != &local_158) {
              operator_delete(local_168._M_unused._M_object,(ulong)(local_158 + 1));
            }
          }
          pthread_rwlock_unlock(__rwlock);
          rm_srv_from_cluster(this,((local_138->config_).
                                    super___shared_ptr<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->id_);
        }
        else {
          local_40 = 
          "rpc failed again for the new coming server (%d), will stop retry for this server";
          snprintf((char *)&local_108,200,
                   "rpc failed again for the new coming server (%d), will stop retry for this server"
                   ,(ulong)(uint)((local_138->config_).
                                  super___shared_ptr<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->id_);
          local_168._M_unused._M_object = &local_158;
          sVar10 = strlen((char *)&local_108);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_168,&local_108,(long)&local_108 + sVar10);
          (*peVar2->_vptr_logger[3])(peVar2,&local_168);
          if ((_Manager_type *)local_168._M_unused._0_8_ != &local_158) {
            operator_delete(local_168._M_unused._M_object,(ulong)(local_158 + 1));
          }
          this->config_changing_ = false;
          p_Var6 = (this->srv_to_join_).
                   super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
          (this->srv_to_join_).super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)0x0;
          (this->srv_to_join_).super___shared_ptr<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
          }
        }
      }
    }
    if (a_Stack_130[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_130[0]._M_pi);
    }
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void raft_server::handle_ext_resp_err(rpc_exception& err)
{
    l_->debug(lstrfmt("receive an rpc error response from peer server, %s").fmt(err.what()));
    ptr<req_msg> req = err.req();
    if (req->get_type() == msg_type::sync_log_request || req->get_type() == msg_type::join_cluster_request ||
        req->get_type() == msg_type::leave_cluster_request)
    {
        ptr<peer> p;
        if (req->get_type() == msg_type::leave_cluster_request)
        {
            read_lock(peers_lock_);
            peer_itor pit = peers_.find(req->get_dst());
            if (pit != peers_.end())
            {
                p = pit->second;
            }
        }
        else
        {
            p = srv_to_join_;
        }

        if (p != nilptr)
        {
            if (p->get_current_hb_interval() >= ctx_->params_->max_hb_interval())
            {
                if (req->get_type() == msg_type::leave_cluster_request)
                {
                    l_->info(lstrfmt("rpc failed again for the removing server (%d), will remove this server directly")
                                 .fmt(p->get_id()));

                    /**
                     * In case of there are only two servers in the cluster, it safe to remove the server directly from
                     * peers as at most one config change could happen at a time prove: assume there could be two config
                     * changes at a time this means there must be a leader after previous leader offline, which is
                     * impossible (no leader could be elected after one server goes offline in case of only two servers
                     * in a cluster) so the bug https://groups.google.com/forum/#!topic/raft-dev/t4xj6dJTP6E does not
                     * apply to cluster which only has two members
                     */
                    {
                        write_lock(peers_lock_);
                        if (peers_.size() == 1)
                        {
                            peer_itor pit = peers_.find(p->get_id());
                            if (pit != peers_.end())
                            {
                                pit->second->enable_hb(false);
                                peers_.erase(pit);
                                l_->info(sstrfmt("server %d is removed from cluster").fmt(p->get_id()));
                            }
                            else
                            {
                                l_->info(sstrfmt("peer %d cannot be found, no action for removing").fmt(p->get_id()));
                            }
                        }
                    }

                    rm_srv_from_cluster(p->get_id());
                }
                else
                {
                    l_->info(lstrfmt("rpc failed again for the new coming server (%d), will stop retry for this server")
                                 .fmt(p->get_id()));
                    config_changing_ = false;
                    srv_to_join_.reset();
                }
            }
            else
            {
                // reuse the heartbeat interval value to indicate when to stop retrying, as rpc backoff is the same
                l_->debug("retry the request");
                p->slow_down_hb();
                timer_task<void>::executor exec = [this, p, req]() mutable { this->on_retryable_req_err(p, req); };
                ptr<delayed_task> task(cs_new<timer_task<void>>(exec));
                scheduler_->schedule(task, p->get_current_hb_interval());
            }
        }
    }
}